

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O1

void __thiscall
haVoc::ScoredMoves::load_and_score
          (ScoredMoves *this,position *p,Movegen *moves,vector<Move,_std::allocator<Move>_> *filters
          ,Move *previous,Move *followup,Move *threat,node *stack,ScoreFunc *score_lambda)

{
  Move *pMVar1;
  U8 UVar2;
  U8 UVar3;
  undefined1 uVar4;
  Score SVar5;
  pointer pMVar6;
  pointer pSVar7;
  bool bVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  Score SVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  U8 *pUVar16;
  long lVar17;
  Move local_5b;
  undefined8 local_58;
  ScoredMoves *local_50;
  position *local_48;
  Move *local_40;
  Move *local_38;
  
  this->m_start = 0;
  this->m_end = 0;
  if (0 < moves->last) {
    pUVar16 = &moves->list[0].type;
    lVar17 = 0;
    local_50 = this;
    local_48 = p;
    local_40 = previous;
    local_38 = followup;
    do {
      pMVar1 = (Move *)(pUVar16 + -2);
      UVar2 = pMVar1->f;
      p = (position *)CONCAT71((int7)((ulong)p >> 8),UVar2);
      UVar3 = pUVar16[-1];
      uVar9 = pMVar1->f;
      uVar10 = pMVar1->t;
      local_5b.t = uVar10;
      local_5b.f = uVar9;
      local_5b.type = *pUVar16;
      pMVar6 = (filters->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((((((UVar2 != pMVar6->f) || (UVar3 != pMVar6->t)) || (local_5b.type != pMVar6->type)) &&
           (((UVar2 != pMVar6[1].f || (UVar3 != pMVar6[1].t)) || (local_5b.type != pMVar6[1].type)))
           ) && (((UVar2 != pMVar6[2].f || (UVar3 != pMVar6[2].t)) ||
                 (local_5b.type != pMVar6[2].type)))) &&
         ((((UVar2 != pMVar6[3].f || (UVar3 != pMVar6[3].t)) || (local_5b.type != pMVar6[3].type))
          && (((UVar2 != pMVar6[4].f || (UVar3 != pMVar6[4].t)) || (local_5b.type != pMVar6[4].type)
              ))))) {
        local_58 = stack;
        if ((score_lambda->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
          pSVar7 = (this->m_moves).
                   super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar15 = this->m_start;
          uVar13 = (uint)((ulong)((long)(this->m_moves).
                                        super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7)
                         >> 3);
          if (uVar13 <= uVar15 + 1) {
            uVar12 = (ulong)(int)this->m_end;
            this->m_start = this->m_end;
            pSVar7 = (this->m_moves).
                     super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar14 = (long)(this->m_moves).
                           super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7 >> 3;
            if (uVar12 < uVar14) {
              uVar15 = this->m_end;
              SVar11 = *(Score *)p;
              do {
                if (SVar11 <= pSVar7[uVar12].s) {
                  uVar15 = uVar15 + 1;
                  this->m_end = uVar15;
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 < uVar14);
            }
            return;
          }
          uVar12 = (ulong)(uVar15 + 1);
          do {
            uVar4 = pSVar7[uVar12].m.f;
            UVar2 = pSVar7[uVar12].m.t;
            UVar3 = pSVar7[uVar12].m.type;
            SVar11 = pSVar7[uVar12].s;
            if (-1 < (int)uVar15) {
              do {
                SVar5 = pSVar7[uVar15].s;
                if (SVar11 <= SVar5) goto LAB_00118fc4;
                pSVar7[(ulong)uVar15 + 1].m.f = pSVar7[uVar15].m.f;
                pSVar7[(ulong)uVar15 + 1].m.t = pSVar7[uVar15].m.t;
                pSVar7[(ulong)uVar15 + 1].m.type = pSVar7[uVar15].m.type;
                pSVar7[(ulong)uVar15 + 1].s = SVar5;
                bVar8 = 0 < (int)uVar15;
                uVar15 = uVar15 - 1;
              } while (bVar8);
              uVar15 = 0xffffffff;
            }
LAB_00118fc4:
            lVar17 = (long)(int)uVar15;
            pSVar7[lVar17 + 1].m.f = uVar4;
            pSVar7[lVar17 + 1].m.t = UVar2;
            pSVar7[lVar17 + 1].m.type = UVar3;
            pSVar7[lVar17 + 1].s = SVar11;
            uVar15 = (uint)uVar12;
            uVar12 = uVar12 + 1;
            if ((uint)uVar12 == uVar13) {
              create_chunk(this,(Score *)p);
              return;
            }
          } while( true );
        }
        p = (position *)&local_58;
        SVar11 = (*score_lambda->_M_invoker)
                           ((_Any_data *)score_lambda,local_48,&local_5b,local_40,local_38,threat,
                            (node **)p);
        local_58._0_3_ = local_5b;
        local_58._4_4_ = SVar11;
        this = local_50;
        std::vector<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>::
        emplace_back<haVoc::ScoredMove>(&local_50->m_moves,(ScoredMove *)p);
      }
      lVar17 = lVar17 + 1;
      pUVar16 = pUVar16 + 3;
    } while (lVar17 < moves->last);
  }
  return;
}

Assistant:

void ScoredMoves::load_and_score(const position& p, Movegen* moves, const std::vector<Move>& filters, const Move& previous, const Move& followup, const Move& threat, node* stack, ScoreFunc score_lambda)
	{
		m_start = m_end = 0;
		for (int i = 0; i < moves->size(); ++i) {
			
			auto m = (*moves)[i];

			// skip hash moves and killers
			if (m == filters[0] || m == filters[1] || m == filters[2] ||
				m == filters[3] || m == filters[4])
				continue;

			Score sc = score_lambda(p, m, previous, followup, threat, stack);
			m_moves.emplace_back(ScoredMove(m, sc));
		}
	}